

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.h
# Opt level: O0

void __thiscall HashMap<int>::reset(HashMap<int> *this)

{
  HashMap<int> *this_local;
  
  if (this->entries != (Node **)0x0) {
    if (this->allocator == (Allocator *)0x0) {
      NULLC::destruct<HashMap<int>::Node*>(this->entries,0x400);
    }
    else {
      Allocator::destruct<HashMap<int>::Node*>(this->allocator,this->entries,0x400);
    }
  }
  this->entries = (Node **)0x0;
  ChunkedStackPool<4092>::~ChunkedStackPool(&this->nodePool);
  return;
}

Assistant:

void reset()
	{
		if(entries)
		{
			if(allocator)
				allocator->destruct(entries, bucketCount);
			else
				NULLC::destruct(entries, bucketCount);
		}

		entries = NULL;
		nodePool.~ChunkedStackPool();
	}